

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPreservingSwapTests.cpp
# Opt level: O0

bool deqp::egl::anon_unknown_0::compareToReference
               (TestLog *log,char *name,char *description,Surface *reference,Surface *screen,int x,
               int y,int width,int height)

{
  bool bVar1;
  ConstPixelBufferAccess local_d8;
  ConstPixelBufferAccess local_b0;
  ConstPixelBufferAccess local_88;
  ConstPixelBufferAccess local_60;
  int local_34;
  Surface *pSStack_30;
  int x_local;
  Surface *screen_local;
  Surface *reference_local;
  char *description_local;
  char *name_local;
  TestLog *log_local;
  
  local_34 = x;
  pSStack_30 = screen;
  screen_local = reference;
  reference_local = (Surface *)description;
  description_local = name;
  name_local = (char *)log;
  tcu::Surface::getAccess(&local_88,reference);
  tcu::getSubregion(&local_60,&local_88,local_34,y,width,height);
  tcu::Surface::getAccess(&local_d8,pSStack_30);
  tcu::getSubregion(&local_b0,&local_d8,local_34,y,width,height);
  bVar1 = tcu::fuzzyCompare(log,name,description,&local_60,&local_b0,0.05,COMPARE_LOG_RESULT);
  return bVar1;
}

Assistant:

bool compareToReference (tcu::TestLog& log, const char* name, const char* description, const tcu::Surface& reference, const tcu::Surface& screen, int x, int y, int width, int height)
{
	return tcu::fuzzyCompare(log, name, description,
							 getSubregion(reference.getAccess(), x, y, width, height),
							 getSubregion(screen.getAccess(), x, y, width, height),
							 0.05f, tcu::COMPARE_LOG_RESULT);
}